

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.cxx
# Opt level: O0

bool __thiscall
cmInstallRuntimeDependencySet::AddBundleExecutable
          (cmInstallRuntimeDependencySet *this,
          unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
          *bundleExecutable)

{
  pointer pIVar1;
  bool bVar2;
  unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  local_28;
  unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  *local_20;
  unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  *bundleExecutable_local;
  cmInstallRuntimeDependencySet *this_local;
  
  bVar2 = this->BundleExecutable == (Item *)0x0;
  if (bVar2) {
    local_20 = bundleExecutable;
    bundleExecutable_local =
         (unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
          *)this;
    pIVar1 = std::
             unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
             ::get(bundleExecutable);
    this->BundleExecutable = pIVar1;
    std::
    unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
    ::unique_ptr(&local_28,bundleExecutable);
    AddExecutable(this,&local_28);
    std::
    unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
    ::~unique_ptr(&local_28);
  }
  return bVar2;
}

Assistant:

bool cmInstallRuntimeDependencySet::AddBundleExecutable(
  std::unique_ptr<Item> bundleExecutable)
{
  if (this->BundleExecutable) {
    return false;
  }
  this->BundleExecutable = bundleExecutable.get();
  this->AddExecutable(std::move(bundleExecutable));
  return true;
}